

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::HandleBlanketJSCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  size_t sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ostream *poVar3;
  string coverageFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string SourceDir;
  cmParseBlanketJSCoverage cov;
  ostringstream cmCTestLog_msg;
  Glob g;
  long *local_298;
  long local_288 [2];
  string local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  string local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  cmParseBlanketJSCoverage local_200;
  undefined1 local_1f0 [112];
  ios_base local_180 [264];
  Glob local_78;
  
  cmParseBlanketJSCoverage::cmParseBlanketJSCoverage
            (&local_200,cont,(this->super_cmCTestGenericHandler).CTest);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_1f0._0_8_ = local_1f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"SourceDirectory","");
  cmCTest::GetCTestConfiguration(&local_238,pcVar1,(string *)local_1f0);
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,local_238._M_dataplus._M_p,
             local_238._M_dataplus._M_p + local_238._M_string_length);
  std::__cxx11::string::append((char *)&local_278);
  cmsys::Glob::Glob(&local_78);
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::Glob::FindFiles(&local_78,&local_278,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_258,__x);
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0," Cannot find BlanketJS coverage files: ",0x27);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,local_278._M_dataplus._M_p,local_278._M_string_length);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x409,(char *)local_298,(this->super_cmCTestGenericHandler).Quiet);
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    std::ios_base::~ios_base(local_180);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Found BlanketJS output JSON, Performing Coverage",0x30);
    std::ios::widen((char)(ostream *)local_1f0 + (char)*(undefined8 *)(local_1f0._0_8_ + -0x18));
    std::ostream::put((char)local_1f0);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x402,(char *)local_298,(this->super_cmCTestGenericHandler).Quiet);
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    std::ios_base::~ios_base(local_180);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_218,&local_258);
    cmParseBlanketJSCoverage::LoadCoverageData(&local_200,&local_218);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
  }
  sVar2 = (cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  cmsys::Glob::~Glob(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  return (int)sVar2;
}

Assistant:

int cmCTestCoverageHandler::HandleBlanketJSCoverage(
  cmCTestCoverageHandlerContainer* cont)
  {
  cmParseBlanketJSCoverage cov =
   cmParseBlanketJSCoverage(*cont, this->CTest);
  std::string SourceDir
    = this->CTest->GetCTestConfiguration("SourceDirectory");

  //Look for something other than output.json, still JSON extension.
  std::string coverageFile = SourceDir+ "/*.json";
  cmsys::Glob g;
  std::vector<std::string> files;
  g.FindFiles(coverageFile);
  files=g.GetFiles();
  if (!files.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "Found BlanketJS output JSON, Performing Coverage" << std::endl,
      this->Quiet);
    cov.LoadCoverageData(files);
    }
  else
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
       " Cannot find BlanketJS coverage files: " << coverageFile
       << std::endl, this->Quiet);
    }
  return static_cast<int>(cont->TotalCoverage.size());
  }